

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O3

void __thiscall
CConnman::NodesSnapshot::NodesSnapshot(NodesSnapshot *this,CConnman *connman,bool shuffle)

{
  pointer ppCVar1;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> __first;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> __last;
  CNode **node;
  pointer ppCVar2;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined1 local_b8 [16];
  ChaCha20 local_a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._0_8_ = &connman->m_nodes_mutex;
  local_b8[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_b8);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::operator=(&this->m_nodes_copy,&connman->m_nodes);
  ppCVar1 = (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
    LOCK();
    ((*ppCVar2)->nRefCount).super___atomic_base<int>._M_i =
         ((*ppCVar2)->nRefCount).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_b8);
  if (shuffle) {
    __first._M_current =
         (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->m_nodes_copy).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    FastRandomContext::FastRandomContext((FastRandomContext *)local_b8,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<CNode**,std::vector<CNode*,std::allocator<CNode*>>>,FastRandomContext>
              (__first,__last,(FastRandomContext *)local_b8);
    ChaCha20::~ChaCha20(&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit NodesSnapshot(const CConnman& connman, bool shuffle)
        {
            {
                LOCK(connman.m_nodes_mutex);
                m_nodes_copy = connman.m_nodes;
                for (auto& node : m_nodes_copy) {
                    node->AddRef();
                }
            }
            if (shuffle) {
                std::shuffle(m_nodes_copy.begin(), m_nodes_copy.end(), FastRandomContext{});
            }
        }